

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

void __thiscall BinHash<DnsHashEntry>::Resize(BinHash<DnsHashEntry> *this,uint newSize)

{
  uint uVar1;
  DnsHashEntry **ppDVar2;
  DnsHashEntry *key;
  ulong in_RAX;
  DnsHashEntry **__s;
  ulong uVar3;
  DnsHashEntry *x;
  bool stored;
  undefined8 uStack_38;
  
  uVar1 = this->tableSize;
  if (uVar1 < newSize) {
    ppDVar2 = this->hashBin;
    uStack_38 = in_RAX;
    __s = (DnsHashEntry **)operator_new__((ulong)newSize << 3);
    this->hashBin = __s;
    this->tableSize = newSize;
    memset(__s,0,(ulong)newSize << 3);
    this->tableCount = 0;
    if (ppDVar2 != (DnsHashEntry **)0x0) {
      if ((ulong)uVar1 != 0) {
        uVar3 = 0;
        do {
          while (key = ppDVar2[uVar3], key != (DnsHashEntry *)0x0) {
            uStack_38 = uStack_38 & 0xffffffffffffff;
            ppDVar2[uVar3] = key->HashNext;
            DoInsert(this,key,false,(bool *)((long)&uStack_38 + 7));
            if (uStack_38._7_1_ == '\0') {
              DnsHashEntry::~DnsHashEntry(key);
              operator_delete(key);
            }
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar1);
      }
      operator_delete__(ppDVar2);
    }
  }
  return;
}

Assistant:

void Resize(unsigned newSize)
    {
        KeyObj ** oldBins = hashBin;
        uint32_t oldSize = tableSize;

        if (oldSize < newSize)
        {
            KeyObj ** newBins = new KeyObj*[newSize];

            if (newBins == NULL)
            {
                /* Cannot allocate memory. Table is unchanged. */
            }
            else
            {
                hashBin = newBins;
                tableSize = newSize;
                memset(hashBin, 0, sizeof(KeyObj *)*tableSize);
                tableCount = 0;

                if (oldBins != NULL)
                {
                    for (unsigned int i = 0; i < oldSize; i++)
                    {
                        while (oldBins[i] != NULL)
                        {
                            KeyObj* x = oldBins[i];
                            bool stored = false;

                            oldBins[i] = x->HashNext;
                            DoInsert(x, false, &stored);
                            if (!stored)
                            {
                                /* This only happens if there was a duplicate in the original table */
                                delete x;
                            }
                        }
                    }
                    
                    delete[] oldBins;
                }
            }
        }
    }